

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_stream.hpp
# Opt level: O3

void __thiscall
libtorrent::aux::ssl_stream<libtorrent::socks5_stream>::set_host_name
          (ssl_stream<libtorrent::socks5_stream> *this,string *name)

{
  undefined8 uVar1;
  error_code ec;
  error_code local_58;
  undefined **local_48 [2];
  error_code local_38;
  _Alloc_hider local_28;
  size_type local_20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_18;
  
  local_58.val_ = 0;
  local_58._4_4_ = local_58._4_4_ & 0xffffff00;
  local_58.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  aux::ssl::set_host_name
            ((((this->m_sock)._M_t.
               super___uniq_ptr_impl<boost::asio::ssl::stream<libtorrent::socks5_stream>,_std::default_delete<boost::asio::ssl::stream<libtorrent::socks5_stream>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_boost::asio::ssl::stream<libtorrent::socks5_stream>_*,_std::default_delete<boost::asio::ssl::stream<libtorrent::socks5_stream>_>_>
               .super__Head_base<0UL,_boost::asio::ssl::stream<libtorrent::socks5_stream>_*,_false>.
              _M_head_impl)->core_).engine_.ssl_,name,&local_58);
  local_38.cat_ = local_58.cat_;
  if (local_58.failed_ != true) {
    return;
  }
  uVar1._4_1_ = local_58.failed_;
  uVar1._5_3_ = local_58._5_3_;
  uVar1._0_4_ = local_58.val_;
  ::std::runtime_error::runtime_error((runtime_error *)local_48,"");
  local_48[0] = &PTR__system_error_004dec78;
  local_28._M_p = (pointer)&local_18;
  local_20 = 0;
  local_18._M_local_buf[0] = '\0';
  local_38._0_8_ = uVar1;
  boost::throw_exception<boost::system::system_error>((system_error *)local_48);
}

Assistant:

void set_host_name(std::string const& name)
	{
		error_code ec;
		set_host_name(name, ec);
		if (ec) boost::throw_exception(boost::system::system_error(ec));
	}